

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O0

void cf_hc_close(Curl_cfilter *cf,Curl_easy *data)

{
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
      (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
     ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
    Curl_trc_cf_infof(data,cf,"close");
  }
  cf_hc_reset(cf,data);
  cf->field_0x24 = cf->field_0x24 & 0xfe;
  if (cf->next != (Curl_cfilter *)0x0) {
    (*(code *)cf->next->cft->do_close)(cf->next,data);
    Curl_conn_cf_discard_chain(&cf->next,data);
  }
  return;
}

Assistant:

static void cf_hc_close(struct Curl_cfilter *cf, struct Curl_easy *data)
{
  CURL_TRC_CF(data, cf, "close");
  cf_hc_reset(cf, data);
  cf->connected = FALSE;

  if(cf->next) {
    cf->next->cft->do_close(cf->next, data);
    Curl_conn_cf_discard_chain(&cf->next, data);
  }
}